

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O3

void __thiscall
Liby::BlockingQueue<std::function<void_()>_>::BlockingQueue
          (BlockingQueue<std::function<void_()>_> *this,
          initializer_list<std::function<void_()>_> elements)

{
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *this_00;
  size_t *psVar1;
  _Node *p_Var2;
  long lVar3;
  function<void_()> *__args;
  function<void_()> *e;
  
  __args = elements._M_array;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this_00 = &this->queue_;
  (this->queue_).super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->queue_).super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->queue_).super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl._M_node._M_size = 0;
  std::condition_variable::condition_variable(&this->cond_);
  if (elements._M_len != 0) {
    lVar3 = elements._M_len << 5;
    do {
      p_Var2 = std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
               _M_create_node<std::function<void()>const&>
                         ((list<std::function<void()>,std::allocator<std::function<void()>>> *)
                          this_00,__args);
      std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
      psVar1 = &(this->queue_).
                super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      __args = __args + 1;
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

BlockingQueue(std::initializer_list<T> elements = {}) {
        for (auto &e : elements) {
            queue_.emplace_back(e);
        }
    }